

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# RelationsAnalyzer.cpp
# Opt level: O1

Shift dg::vr::RelationsAnalyzer::getShift(BinaryOperator *op,VectorSet<const_llvm::Value_*> *froms)

{
  BinaryOperator BVar1;
  uint uVar2;
  long lVar3;
  int iVar4;
  long lVar5;
  __normal_iterator<const_llvm::Value_*const_*,_std::vector<const_llvm::Value_*,_std::allocator<const_llvm::Value_*>_>_>
  _Var6;
  long lVar7;
  bool bVar8;
  
  lVar3 = *(long *)(op + -0x40);
  if ((*(char *)(lVar3 + 0x10) == '\x10') == (*(char *)(*(long *)(op + -0x20) + 0x10) == '\x10')) {
    return UNKNOWN;
  }
  if (*(char *)(lVar3 + 0x10) == '\x10') {
    lVar5 = *(long *)(op + -0x20);
    lVar7 = lVar3;
  }
  else {
    lVar7 = *(long *)(op + -0x20);
    lVar5 = lVar3;
  }
  if (lVar5 == 0) {
    return UNKNOWN;
  }
  if (*(char *)(lVar5 + 0x10) != ';') {
    return UNKNOWN;
  }
  _Var6 = std::
          __find_if<__gnu_cxx::__normal_iterator<llvm::Value_const*const*,std::vector<llvm::Value_const*,std::allocator<llvm::Value_const*>>>,__gnu_cxx::__ops::_Iter_equals_val<llvm::Value_const*const>>
                    ((froms->vec).
                     super__Vector_base<const_llvm::Value_*,_std::allocator<const_llvm::Value_*>_>.
                     _M_impl.super__Vector_impl_data._M_start,
                     (froms->vec).
                     super__Vector_base<const_llvm::Value_*,_std::allocator<const_llvm::Value_*>_>.
                     _M_impl.super__Vector_impl_data._M_finish);
  if (_Var6._M_current !=
      (froms->vec).super__Vector_base<const_llvm::Value_*,_std::allocator<const_llvm::Value_*>_>.
      _M_impl.super__Vector_impl_data._M_finish) {
    BVar1 = op[0x10];
    if (BVar1 == (BinaryOperator)0x28) {
      uVar2 = *(uint *)(lVar7 + 0x20);
      if (uVar2 < 0x41) {
        bVar8 = *(long *)(lVar7 + 0x18) == 1;
      }
      else {
        iVar4 = llvm::APInt::countLeadingZerosSlowCase();
        bVar8 = iVar4 == uVar2 - 1;
      }
      if (bVar8) {
        return INC;
      }
    }
    if ((BVar1 == (BinaryOperator)0x2a) &&
       (bVar8 = llvm::APInt::isAllOnes((APInt *)(lVar7 + 0x18)), bVar8)) {
      return INC;
    }
    if ((BVar1 == (BinaryOperator)0x28) &&
       (bVar8 = llvm::APInt::isAllOnes((APInt *)(lVar7 + 0x18)), bVar8)) {
      return DEC;
    }
    if (BVar1 == (BinaryOperator)0x2a) {
      uVar2 = *(uint *)(lVar7 + 0x20);
      if (uVar2 < 0x41) {
        bVar8 = *(long *)(lVar7 + 0x18) == 1;
      }
      else {
        iVar4 = llvm::APInt::countLeadingZerosSlowCase();
        bVar8 = iVar4 == uVar2 - 1;
      }
      if (bVar8) {
        return DEC;
      }
    }
    return UNKNOWN;
  }
  return UNKNOWN;
}

Assistant:

RelationsAnalyzer::Shift
RelationsAnalyzer::getShift(const llvm::BinaryOperator *op,
                            const VectorSet<V> &froms) {
    if (llvm::isa<llvm::ConstantInt>(op->getOperand(0)) ==
        llvm::isa<llvm::ConstantInt>(op->getOperand(1)))
        return Shift::UNKNOWN;
    V param = nullptr;
    llvm::ConstantInt *c = nullptr;
    std::tie(param, c) = getParams(op);

    assert(param && c);
    auto load = llvm::dyn_cast<llvm::LoadInst>(param);
    if (!load || !froms.contains(load->getPointerOperand()))
        return Shift::UNKNOWN;

    auto opcode = op->getOpcode();
    if ((opcode == llvm::Instruction::Add && c->isOne()) ||
        (opcode == llvm::Instruction::Sub && c->isMinusOne())) {
        return Shift::INC;
    }
    if ((opcode == llvm::Instruction::Add && c->isMinusOne()) ||
        (opcode == llvm::Instruction::Sub && c->isOne())) {
        return Shift::DEC;
    }
    return Shift::UNKNOWN;
}